

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

ExceptionCallback * kj::getExceptionCallback(void)

{
  int iVar1;
  ExceptionCallback *pEVar2;
  long in_FS_OFFSET;
  
  if (getExceptionCallback()::defaultCallback == '\0') {
    iVar1 = __cxa_guard_acquire(&getExceptionCallback()::defaultCallback);
    if (iVar1 != 0) {
      getExceptionCallback::defaultCallback = (RootExceptionCallback *)operator_new(0x10);
      ((ExceptionCallback *)getExceptionCallback::defaultCallback)->next =
           (ExceptionCallback *)getExceptionCallback::defaultCallback;
      ((ExceptionCallback *)getExceptionCallback::defaultCallback)->_vptr_ExceptionCallback =
           (_func_int **)&PTR__ExceptionCallback_00626068;
      __cxa_guard_release(&getExceptionCallback()::defaultCallback);
    }
  }
  pEVar2 = *(ExceptionCallback **)(in_FS_OFFSET + -8);
  if (*(ExceptionCallback **)(in_FS_OFFSET + -8) == (ExceptionCallback *)0x0) {
    pEVar2 = &getExceptionCallback::defaultCallback->super_ExceptionCallback;
  }
  return pEVar2;
}

Assistant:

ExceptionCallback& getExceptionCallback() {
  static auto defaultCallback = lsanIgnoreObjectAndReturn(
      new ExceptionCallback::RootExceptionCallback());
  // We allocate on the heap because some objects may throw in their destructors. If those objects
  // had static storage, they might get fully constructed before the root callback. If they however
  // then throw an exception during destruction, there would be a lifetime issue because their
  // destructor would end up getting registered after the root callback's destructor. One solution
  // is to just leak this pointer & allocate on first-use. The cost is that the initialization is
  // mildly more expensive (+ we need to annotate sanitizers to ignore the problem). A great
  // compiler annotation that would simply things would be one that allowed static variables to have
  // their destruction omitted wholesale. That would allow us to avoid the heap but still have the
  // same robust safety semantics leaking would give us. A practical alternative that could be
  // implemented without new compilers would be to define another static root callback in
  // RootExceptionCallback's destructor (+ a separate pointer to share its value with this
  // function). Since this would end up getting constructed during exit unwind, it would have the
  // nice property of effectively being guaranteed to be evicted last.
  //
  // All this being said, I came back to leaking the object is the easiest tweak here:
  //  * Can't go wrong
  //  * Easy to maintain
  //  * Throwing exceptions is bound to do be expensive and malloc-happy anyway, so the incremental
  //    cost of 1 heap allocation is minimal.
  //
  // TODO(cleanup): Harris has an excellent suggestion in
  //  https://github.com/capnproto/capnproto/pull/1255 that should ensure we initialize the root
  //  callback once on first use as a global & never destroy it.

  ExceptionCallback* scoped = threadLocalCallback;
  return scoped != nullptr ? *scoped : *defaultCallback;
}